

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  _GLFWlibrary *p_Var1;
  GLFWbool GVar2;
  int iVar3;
  _GLFWwindow *window;
  _GLFWwindow *handle;
  long lVar4;
  anon_struct_200_4_80ee7fb7_for_hints *paVar5;
  _GLFWfbconfig *p_Var6;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig local_e8;
  _GLFWctxconfig local_a8;
  _GLFWfbconfig local_70;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/window.c"
                  ,0x84,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfw.initialized == 0) {
    iVar3 = 0x10001;
  }
  else {
    if (width < 1 || height < 1) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,height);
      return (GLFWwindow *)0x0;
    }
    p_Var1 = &_glfw;
    p_Var6 = &local_70;
    for (lVar4 = 9; paVar5 = &p_Var1->hints, lVar4 != 0; lVar4 = lVar4 + -1) {
      p_Var1 = (_GLFWlibrary *)&paVar5->framebuffer;
      iVar3 = (paVar5->framebuffer).greenBits;
      p_Var6->redBits = (paVar5->framebuffer).redBits;
      p_Var6->greenBits = iVar3;
      p_Var6 = (_GLFWfbconfig *)&p_Var6->blueBits;
    }
    local_a8._48_8_ = _glfw.hints.context._48_8_;
    local_a8._32_8_ = _glfw.hints.context._32_8_;
    local_a8._16_8_ = _glfw.hints.context._16_8_;
    local_a8._24_8_ = _glfw.hints.context._24_8_;
    local_a8._0_8_ = _glfw.hints.context._0_8_;
    local_a8._8_8_ = _glfw.hints.context._8_8_;
    local_e8.nativeParent = _glfw.hints.window.nativeParent;
    local_e8._24_8_ = _glfw.hints.window._24_8_;
    local_e8._32_8_ = _glfw.hints.window._32_8_;
    local_e8._40_8_ = _glfw.hints.window._40_8_;
    local_e8._48_8_ = _glfw.hints.window._48_8_;
    local_e8.ns = _glfw.hints.window.ns;
    local_e8.height = height;
    local_e8.width = width;
    local_e8.title = title;
    local_a8.share = (_GLFWwindow *)share;
    if ((share == (GLFWwindow *)0x0) ||
       ((local_a8.client = _glfw.hints.context.client, local_a8.client != 0 &&
        (*(int *)(share + 0x1f0) != 0)))) {
      GVar2 = _glfwIsValidContextConfig(&local_a8);
      if (GVar2 != 0) {
        window = (_GLFWwindow *)calloc(1,0x368);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        (window->videoMode).redBits = local_70.redBits;
        (window->videoMode).greenBits = local_70.greenBits;
        (window->videoMode).blueBits = local_70.blueBits;
        (window->videoMode).refreshRate = _glfw.hints.refreshRate;
        window->monitor = (_GLFWmonitor *)monitor;
        window->resizable = local_e8.resizable;
        window->decorated = local_e8.decorated;
        window->autoIconify = local_e8.autoIconify;
        window->floating = local_e8.floating;
        window->cursorMode = 0x34001;
        window->minwidth = -1;
        window->minheight = -1;
        window->maxwidth = -1;
        window->maxheight = -1;
        window->numer = -1;
        window->denom = -1;
        handle = _glfwPlatformGetCurrentContext();
        if (local_a8.client != 0) {
          glfwMakeContextCurrent((GLFWwindow *)0x0);
        }
        iVar3 = _glfwPlatformCreateWindow(window,&local_e8,&local_a8,&local_70);
        if (iVar3 == 0) {
          glfwMakeContextCurrent((GLFWwindow *)handle);
        }
        else {
          if (local_a8.client == 0) {
LAB_00117d9a:
            if (window->monitor != (_GLFWmonitor *)0x0) {
              return (GLFWwindow *)window;
            }
            if (local_e8.visible == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformShowWindow(window);
            if (local_e8.focused == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformFocusWindow(window);
            return (GLFWwindow *)window;
          }
          (*(window->context).makeCurrent)(window);
          GVar2 = _glfwRefreshContextAttribs(&local_a8);
          glfwMakeContextCurrent((GLFWwindow *)handle);
          if (GVar2 != 0) goto LAB_00117d9a;
        }
        glfwDestroyWindow((GLFWwindow *)window);
      }
      return (GLFWwindow *)0x0;
    }
    iVar3 = 0x1000a;
  }
  _glfwInputError(iVar3,(char *)0x0);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    assert(title != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (ctxconfig.share)
    {
        if (ctxconfig.client == GLFW_NO_API ||
            ctxconfig.share->context.client == GLFW_NO_API)
        {
            _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
            return NULL;
        }
    }

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();
    if (ctxconfig.client != GLFW_NO_API)
        glfwMakeContextCurrent(NULL);

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwMakeContextCurrent((GLFWwindow*) previous);
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        window->context.makeCurrent(window);

        // Retrieve the actual (as opposed to requested) context attributes
        if (!_glfwRefreshContextAttribs(&ctxconfig))
        {
            glfwMakeContextCurrent((GLFWwindow*) previous);
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }

        // Restore the previously current context (or NULL)
        glfwMakeContextCurrent((GLFWwindow*) previous);
    }

    if (!window->monitor)
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}